

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O2

alik_css_object alik_css_init(int p,int d,int q,int N)

{
  uint uVar1;
  alik_css_object paVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  
  if ((p < 0x65) && (q < 0x65)) {
    paVar2 = (alik_css_object)malloc((long)N * 0x18 + 0x688);
    paVar2->p = p;
    paVar2->d = d;
    paVar2->q = q;
    paVar2->N = N;
    paVar2->length = N;
    paVar2->pq = q + p;
    paVar2->M = 0;
    if (d == 0) {
      paVar2->pq = q + p + 1;
      paVar2->M = 1;
    }
    uVar1 = q + 1;
    if (q < p) {
      uVar1 = p;
    }
    paVar2->r = uVar1;
    uVar4 = 0;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      paVar2->phi[uVar4] = 0.0;
    }
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      paVar2->theta[uVar4] = 0.0;
    }
    dVar5 = macheps();
    paVar2->eps = dVar5;
    paVar2->mean = 0.0;
    return paVar2;
  }
  puts("\n p and q should be less than 100. ");
  puts("Use sarima_init if either p > 100 or q > 100 ");
  exit(1);
}

Assistant:

alik_css_object alik_css_init(int p, int d, int q, int N) {
	alik_css_object obj = NULL;
	int i, t;
	if (p > 100 || q > 100) {
		printf("\n p and q should be less than 100. \n");
		printf("Use sarima_init if either p > 100 or q > 100 \n");
		exit(1);
	}

	obj = (alik_css_object)malloc(sizeof(struct alik_css_set) + sizeof(double)* 3 * N);

	obj->p = p;
	obj->d = d;
	obj->q = q;
	obj->N = N;
	obj->length = N;
	obj->pq = p + q;
	obj->M = 0;

	if (d == 0) {
		obj->pq = obj->pq + 1;
		obj->M = 1;
	}

	obj->r = p;

	t = 1 + q;
	if (obj->r < t) {
		obj->r = t;
	}
	t = obj->r;
	for (i = 0; i < t; ++i) {
		obj->phi[i] = 0.0;
	}

	for (i = 0; i < t; ++i) {
		obj->theta[i] = 0.0;
	}
	obj->eps = macheps();
	obj->mean = 0.0;

	return obj;
}